

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O3

void joined_subflow_2(uint W)

{
  U *pUVar1;
  int *piVar2;
  int iVar3;
  code *pcVar4;
  double dVar5;
  long *plVar6;
  undefined8 this;
  char extraout_AL;
  bool bVar7;
  Executor *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar9;
  atomic<bool> post_join;
  ResultBuilder DOCTEST_RB;
  Taskflow taskflow;
  Executor executor;
  undefined1 local_2d2;
  bool local_2d1;
  ResultBuilder local_2d0;
  Result local_258;
  shared_ptr<tf::WorkerInterface> local_238;
  undefined1 *local_228;
  undefined4 local_220;
  undefined1 local_218 [80];
  pointer local_1c8;
  pointer puStack_1c0;
  pointer local_1b8;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_1b0;
  bool local_158;
  Executor local_150;
  
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_150,(ulong)W,&local_238);
  if (local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_218._0_8_ = &local_1c8;
  local_218._8_8_ = 0;
  local_218._16_8_ = 0;
  local_218._24_8_ = 0;
  local_218._32_8_ = (__pthread_internal_list *)0x0;
  local_218._40_8_ = (__pthread_internal_list *)0x0;
  local_218._48_8_ = local_218 + 0x40;
  local_218._56_8_ = 0;
  local_218[0x40] = '\0';
  local_1c8 = (pointer)0x0;
  puStack_1c0 = (pointer)0x0;
  local_1b8 = (pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1b0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_1b0,0);
  this = local_218._0_8_;
  local_158 = false;
  local_2d2 = 0;
  local_2d0.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_2d0.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_2d0.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_2d0.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_2d0.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_2d0.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_2d0.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_2d0.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_2d0.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_2d0.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined1 **)
   &(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = &local_2d2;
  *(code **)((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:337:20)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:337:20)>
       ::_M_manager;
  *(undefined8 *)
   ((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x20) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x28) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x30) = 0;
  *(__index_type *)
   ((long)&(((Node *)local_2d0.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x03';
  (((Node *)local_2d0.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_2d0.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)this,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2d0);
  if ((Node *)local_2d0.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_2d0,(Node *)local_2d0.super_AssertData.m_test_case
              );
  }
  local_258.m_passed = true;
  local_258._1_7_ = 0;
  this_00 = &local_150;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            ((Future<void> *)&local_2d0,this_00,(Taskflow *)local_218,
             (anon_class_8_1_69701ed9 *)&local_258,(anon_class_1_0_00000001 *)&local_228);
  if ((Node *)local_2d0.super_AssertData.m_test_case == (Node *)0x0) {
    std::__throw_future_error(3);
  }
  std::__future_base::_State_baseV2::wait
            ((_State_baseV2 *)local_2d0.super_AssertData.m_test_case,this_00);
  plVar6 = (long *)CONCAT44(local_2d0.super_AssertData._28_4_,local_2d0.super_AssertData.m_line);
  if (plVar6 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = (int *)((long)plVar6 + 0xc);
      iVar3 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)plVar6 + 0xc);
      *(int *)((long)plVar6 + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)(*plVar6 + 0x18))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_2d0.super_AssertData._12_4_,local_2d0.super_AssertData.m_at) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_2d0.super_AssertData._12_4_,local_2d0.super_AssertData.m_at));
  }
  local_2d0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_2d0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_2d0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_2d0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_2d0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_2d0.super_AssertData.m_at = DT_REQUIRE;
  local_2d0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
  ;
  local_2d0.super_AssertData.m_line = 0x15f;
  local_2d0.super_AssertData.m_expr = "post_join == false";
  local_2d0.super_AssertData.m_failed = true;
  local_2d0.super_AssertData.m_threw = false;
  local_2d0.super_AssertData.m_threw_as = false;
  local_2d0.super_AssertData.m_exception_type = "";
  local_2d0.super_AssertData.m_exception_string = "";
  local_220 = 0xc;
  local_2d1 = false;
  local_228 = &local_2d2;
  doctest::detail::Expression_lhs<std::atomic<bool>const&>::operator==
            (&local_258,(Expression_lhs<std::atomic<bool>const&> *)&local_228,&local_2d1);
  doctest::String::operator=(&local_2d0.super_AssertData.m_decomp,&local_258.m_decomp);
  local_2d0.super_AssertData._40_2_ =
       CONCAT11(local_2d0.super_AssertData.m_threw,local_258.m_passed) ^ 1;
  uVar8 = extraout_XMM0_Da;
  uVar9 = extraout_XMM0_Db;
  if ((local_258.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_258.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_258.m_decomp.field_0.data.ptr);
    uVar8 = extraout_XMM0_Da_00;
    uVar9 = extraout_XMM0_Db_00;
  }
  dVar5 = doctest::detail::ResultBuilder::log(&local_2d0,(double)CONCAT44(uVar9,uVar8));
  if (extraout_AL != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)(SUB84(dVar5,0));
    return;
  }
  if (local_2d0.super_AssertData.m_failed == true) {
    bVar7 = doctest::detail::checkIfShouldThrow(local_2d0.super_AssertData.m_at);
    if (bVar7) {
      doctest::detail::throwException();
    }
  }
  if ((local_2d0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2d0.super_AssertData.m_decomp.field_0._1_7_,
                       local_2d0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2d0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_2d0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_2d0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2d0.super_AssertData.m_exception.field_0._1_7_,
                       local_2d0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2d0.super_AssertData.m_exception.field_0._1_7_,
                                       local_2d0.super_AssertData.m_exception.field_0.buf[0]));
  }
  tf::Taskflow::~Taskflow((Taskflow *)local_218);
  tf::Executor::~Executor(&local_150);
  return;
}

Assistant:

void joined_subflow_2(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::atomic<bool> post_join {false};

  taskflow.emplace([&](tf::Subflow& sf0){
    for (int j = 0; j < 16; ++j) {
      sf0.emplace([] () {
        throw std::runtime_error("x");
      });
    }
    try {
      sf0.join();
      post_join = true;
    } catch(const std::runtime_error& re) {
      REQUIRE(std::strcmp(re.what(), "x") == 0);
    }
  });
  executor.run(taskflow).wait();
  REQUIRE(post_join == false);
}